

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O3

ssize_t __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::write
          (SamplingStrategyResponse *this,int __fd,void *__buf,size_t __n)

{
  _SamplingStrategyResponse__isset _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  size_t sVar7;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar2 = (*this_00->_vptr_TProtocol[4])(this_00,"SamplingStrategyResponse");
  iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"strategyType",8,1);
  iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)this->strategyType);
  iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) != 0) {
    sVar7 = 2;
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"probabilisticSampling",0xc);
    sVar6 = ProbabilisticSamplingStrategy::write(&this->probabilisticSampling,__fd,__buf_00,sVar7);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = (int)sVar6 + iVar4 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 2) != 0) {
    sVar7 = 3;
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"rateLimitingSampling",0xc);
    sVar6 = RateLimitingSamplingStrategy::write(&this->rateLimitingSampling,__fd,__buf_01,sVar7);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = (int)sVar6 + iVar4 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 4) != 0) {
    sVar7 = 4;
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"operationSampling",0xc);
    sVar6 = PerOperationSamplingStrategies::write(&this->operationSampling,__fd,__buf_02,sVar7);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = (int)sVar6 + iVar4 + iVar3 + iVar2;
  }
  iVar3 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar3 + iVar2 + iVar4);
}

Assistant:

uint32_t SamplingStrategyResponse::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("SamplingStrategyResponse");

  xfer += oprot->writeFieldBegin("strategyType", ::apache::thrift::protocol::T_I32, 1);
  xfer += oprot->writeI32((int32_t)this->strategyType);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.probabilisticSampling) {
    xfer += oprot->writeFieldBegin("probabilisticSampling", ::apache::thrift::protocol::T_STRUCT, 2);
    xfer += this->probabilisticSampling.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.rateLimitingSampling) {
    xfer += oprot->writeFieldBegin("rateLimitingSampling", ::apache::thrift::protocol::T_STRUCT, 3);
    xfer += this->rateLimitingSampling.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.operationSampling) {
    xfer += oprot->writeFieldBegin("operationSampling", ::apache::thrift::protocol::T_STRUCT, 4);
    xfer += this->operationSampling.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}